

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

void GC::CheckArrayElements(char *ptr,uint size,ExternTypeInfo *elementType)

{
  bool bVar1;
  
  if (elementType->pointerCount != 0) {
    switch(elementType->subCat) {
    case CAT_ARRAY:
      while (bVar1 = size != 0, size = size - 1, bVar1) {
        CheckArray(ptr,elementType);
        ptr = ptr + elementType->size;
      }
      break;
    case CAT_POINTER:
      while (bVar1 = size != 0, size = size - 1, bVar1) {
        CheckPointer(ptr);
        ptr = ptr + elementType->size;
      }
      break;
    case CAT_FUNCTION:
      while (bVar1 = size != 0, size = size - 1, bVar1) {
        CheckFunction(ptr);
        ptr = ptr + elementType->size;
      }
      break;
    case CAT_CLASS:
      while (bVar1 = size != 0, size = size - 1, bVar1) {
        CheckClass(ptr,elementType);
        ptr = ptr + elementType->size;
      }
    }
  }
  return;
}

Assistant:

void CheckArrayElements(char* ptr, unsigned size, const ExternTypeInfo& elementType)
	{
		if(!elementType.pointerCount)
			return;

		// Check every array element
		switch(elementType.subCat)
		{
		case ExternTypeInfo::CAT_NONE:
			break;
		case ExternTypeInfo::CAT_ARRAY:
			for(unsigned i = 0; i < size; i++, ptr += elementType.size)
				CheckArray(ptr, elementType);
			break;
		case ExternTypeInfo::CAT_POINTER:
			for(unsigned i = 0; i < size; i++, ptr += elementType.size)
				CheckPointer(ptr);
			break;
		case ExternTypeInfo::CAT_FUNCTION:
			for(unsigned i = 0; i < size; i++, ptr += elementType.size)
				CheckFunction(ptr);
			break;
		case ExternTypeInfo::CAT_CLASS:
			for(unsigned i = 0; i < size; i++, ptr += elementType.size)
				CheckClass(ptr, elementType);
			break;
		}
	}